

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_sse2.h
# Opt level: O0

void VP8L32bToPlanar_SSE2(__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  __m128i C3;
  __m128i C2;
  __m128i C1;
  __m128i C0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_158 = (undefined1)uVar1;
  uStack_157 = (undefined1)((ulong)uVar1 >> 8);
  uStack_156 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_155 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_154 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_153 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_152 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_151 = (undefined1)((ulong)uVar1 >> 0x38);
  local_168 = (undefined1)uVar2;
  uStack_167 = (undefined1)((ulong)uVar2 >> 8);
  uStack_166 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_165 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_164 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_163 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_162 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_161 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[1];
  uVar2 = in_RSI[1];
  uStack_90 = (undefined1)uVar1;
  uStack_8f = (undefined1)((ulong)uVar1 >> 8);
  uStack_8e = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8d = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_8c = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_8b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_89 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_a0 = (undefined1)uVar2;
  uStack_9f = (undefined1)((ulong)uVar2 >> 8);
  uStack_9e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_9d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_9c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_9b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_9a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_99 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_178 = (undefined1)uVar1;
  uStack_177 = (undefined1)((ulong)uVar1 >> 8);
  uStack_176 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_175 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_174 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_173 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_172 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_171 = (undefined1)((ulong)uVar1 >> 0x38);
  local_188 = (undefined1)uVar2;
  uStack_187 = (undefined1)((ulong)uVar2 >> 8);
  uStack_186 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_185 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_184 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_183 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_182 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_181 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDX[1];
  uVar2 = in_RCX[1];
  uStack_b0 = (undefined1)uVar1;
  uStack_af = (undefined1)((ulong)uVar1 >> 8);
  uStack_ae = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_ad = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_ac = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_ab = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_aa = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_a9 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_c0 = (undefined1)uVar2;
  uStack_bf = (undefined1)((ulong)uVar2 >> 8);
  uStack_be = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_bd = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_bc = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_bb = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_ba = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_b9 = (undefined1)((ulong)uVar2 >> 0x38);
  *(undefined1 *)in_RDI = uStack_155;
  *(undefined1 *)((long)in_RDI + 1) = uStack_151;
  *(undefined1 *)((long)in_RDI + 2) = uStack_8d;
  *(undefined1 *)((long)in_RDI + 3) = uStack_89;
  *(undefined1 *)((long)in_RDI + 4) = uStack_165;
  *(undefined1 *)((long)in_RDI + 5) = uStack_161;
  *(undefined1 *)((long)in_RDI + 6) = uStack_9d;
  *(undefined1 *)((long)in_RDI + 7) = uStack_99;
  *(undefined1 *)(in_RDI + 1) = uStack_175;
  *(undefined1 *)((long)in_RDI + 9) = uStack_171;
  *(undefined1 *)((long)in_RDI + 10) = uStack_ad;
  *(undefined1 *)((long)in_RDI + 0xb) = uStack_a9;
  *(undefined1 *)((long)in_RDI + 0xc) = uStack_185;
  *(undefined1 *)((long)in_RDI + 0xd) = uStack_181;
  *(undefined1 *)((long)in_RDI + 0xe) = uStack_bd;
  *(undefined1 *)((long)in_RDI + 0xf) = uStack_b9;
  *(undefined1 *)in_RSI = uStack_156;
  *(undefined1 *)((long)in_RSI + 1) = uStack_152;
  *(undefined1 *)((long)in_RSI + 2) = uStack_8e;
  *(undefined1 *)((long)in_RSI + 3) = uStack_8a;
  *(undefined1 *)((long)in_RSI + 4) = uStack_166;
  *(undefined1 *)((long)in_RSI + 5) = uStack_162;
  *(undefined1 *)((long)in_RSI + 6) = uStack_9e;
  *(undefined1 *)((long)in_RSI + 7) = uStack_9a;
  *(undefined1 *)(in_RSI + 1) = uStack_176;
  *(undefined1 *)((long)in_RSI + 9) = uStack_172;
  *(undefined1 *)((long)in_RSI + 10) = uStack_ae;
  *(undefined1 *)((long)in_RSI + 0xb) = uStack_aa;
  *(undefined1 *)((long)in_RSI + 0xc) = uStack_186;
  *(undefined1 *)((long)in_RSI + 0xd) = uStack_182;
  *(undefined1 *)((long)in_RSI + 0xe) = uStack_be;
  *(undefined1 *)((long)in_RSI + 0xf) = uStack_ba;
  *(undefined1 *)in_RDX = uStack_157;
  *(undefined1 *)((long)in_RDX + 1) = uStack_153;
  *(undefined1 *)((long)in_RDX + 2) = uStack_8f;
  *(undefined1 *)((long)in_RDX + 3) = uStack_8b;
  *(undefined1 *)((long)in_RDX + 4) = uStack_167;
  *(undefined1 *)((long)in_RDX + 5) = uStack_163;
  *(undefined1 *)((long)in_RDX + 6) = uStack_9f;
  *(undefined1 *)((long)in_RDX + 7) = uStack_9b;
  *(undefined1 *)(in_RDX + 1) = uStack_177;
  *(undefined1 *)((long)in_RDX + 9) = uStack_173;
  *(undefined1 *)((long)in_RDX + 10) = uStack_af;
  *(undefined1 *)((long)in_RDX + 0xb) = uStack_ab;
  *(undefined1 *)((long)in_RDX + 0xc) = uStack_187;
  *(undefined1 *)((long)in_RDX + 0xd) = uStack_183;
  *(undefined1 *)((long)in_RDX + 0xe) = uStack_bf;
  *(undefined1 *)((long)in_RDX + 0xf) = uStack_bb;
  *(undefined1 *)in_RCX = local_158;
  *(undefined1 *)((long)in_RCX + 1) = uStack_154;
  *(undefined1 *)((long)in_RCX + 2) = uStack_90;
  *(undefined1 *)((long)in_RCX + 3) = uStack_8c;
  *(undefined1 *)((long)in_RCX + 4) = local_168;
  *(undefined1 *)((long)in_RCX + 5) = uStack_164;
  *(undefined1 *)((long)in_RCX + 6) = uStack_a0;
  *(undefined1 *)((long)in_RCX + 7) = uStack_9c;
  *(undefined1 *)(in_RCX + 1) = local_178;
  *(undefined1 *)((long)in_RCX + 9) = uStack_174;
  *(undefined1 *)((long)in_RCX + 10) = uStack_b0;
  *(undefined1 *)((long)in_RCX + 0xb) = uStack_ac;
  *(undefined1 *)((long)in_RCX + 0xc) = local_188;
  *(undefined1 *)((long)in_RCX + 0xd) = uStack_184;
  *(undefined1 *)((long)in_RCX + 0xe) = uStack_c0;
  *(undefined1 *)((long)in_RCX + 0xf) = uStack_bc;
  return;
}

Assistant:

static WEBP_INLINE void VP8L32bToPlanar_SSE2(__m128i* const in0,
                                             __m128i* const in1,
                                             __m128i* const in2,
                                             __m128i* const in3) {
  // Column-wise transpose.
  const __m128i A0 = _mm_unpacklo_epi8(*in0, *in1);
  const __m128i A1 = _mm_unpackhi_epi8(*in0, *in1);
  const __m128i A2 = _mm_unpacklo_epi8(*in2, *in3);
  const __m128i A3 = _mm_unpackhi_epi8(*in2, *in3);
  const __m128i B0 = _mm_unpacklo_epi8(A0, A1);
  const __m128i B1 = _mm_unpackhi_epi8(A0, A1);
  const __m128i B2 = _mm_unpacklo_epi8(A2, A3);
  const __m128i B3 = _mm_unpackhi_epi8(A2, A3);
  // C0 = g7 g6 ... g1 g0 | b7 b6 ... b1 b0
  // C1 = a7 a6 ... a1 a0 | r7 r6 ... r1 r0
  const __m128i C0 = _mm_unpacklo_epi8(B0, B1);
  const __m128i C1 = _mm_unpackhi_epi8(B0, B1);
  const __m128i C2 = _mm_unpacklo_epi8(B2, B3);
  const __m128i C3 = _mm_unpackhi_epi8(B2, B3);
  // Gather the channels.
  *in0 = _mm_unpackhi_epi64(C1, C3);
  *in1 = _mm_unpacklo_epi64(C1, C3);
  *in2 = _mm_unpackhi_epi64(C0, C2);
  *in3 = _mm_unpacklo_epi64(C0, C2);
}